

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tape.cpp
# Opt level: O3

Time __thiscall Storage::Tape::Tape::get_current_time(Tape *this)

{
  int iVar1;
  undefined4 extraout_var;
  uint extraout_var_00;
  ulong uVar2;
  Time __m;
  unsigned_long uVar3;
  uint extraout_EDX;
  uint uVar4;
  _Ct __n2;
  ulong __n;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  _Ct __m2;
  Time TVar8;
  
  iVar1 = (*this->_vptr_Tape[1])();
  lVar6 = CONCAT44(extraout_var,iVar1);
  this->offset_ = 0;
  (*this->_vptr_Tape[8])(this);
  if (lVar6 == 0) {
    TVar8.length = 0;
    TVar8.clock_rate = 1;
    return TVar8;
  }
  __m.length = 0;
  __m.clock_rate = 0;
  __n = 1;
LAB_0045208a:
  iVar1 = (*this->_vptr_Tape[7])(this);
  (this->pulse_).type = iVar1;
  (this->pulse_).length.length = extraout_var_00;
  (this->pulse_).length.clock_rate = extraout_EDX;
  this->offset_ = this->offset_ + 1;
  uVar2 = (ulong)extraout_var_00;
  uVar5 = __n;
  if (uVar2 != 0) {
    if (__m.length == 0) {
      __m = (this->pulse_).length;
      uVar5 = (ulong)__m >> 0x20;
    }
    else {
      if ((uint)__n == extraout_EDX) {
        __m = (Time)(uVar2 + ((ulong)__m & 0xffffffff));
      }
      else {
        __m = (Time)(uVar2 * __n + ((ulong)__m & 0xffffffff) * (ulong)extraout_EDX);
        __n = __n * extraout_EDX;
      }
      if ((__n | (ulong)__m) >> 0x20 != 0) {
        uVar5 = 1;
        if (__m == (Time)0x0) {
          __m.length = 0;
          __m.clock_rate = 0;
          goto LAB_0045219d;
        }
        TVar8 = __m;
        if (((__n | (ulong)__m) & 0xf) == 0) {
          do {
            __m = (Time)((ulong)TVar8 >> 4);
            uVar4 = (uint)__n;
            uVar7 = TVar8.length;
            __n = __n >> 4;
            TVar8 = __m;
          } while (((uVar7 | uVar4) & 0xf0) == 0);
        }
        uVar4 = (__m.length | (uint)__n) & 1;
        while (uVar4 == 0) {
          uVar4 = (uint)__n;
          __n = __n >> 1;
          uVar4 = (__m.length | uVar4) & 2;
          __m = (Time)((ulong)__m >> 1);
        }
        if (((ulong)__m >> 0x20 != 0) || (__n >> 0x20 != 0)) {
          uVar3 = std::__detail::__gcd<unsigned_long>((unsigned_long)__m,__n);
          __m = (Time)((ulong)__m / uVar3);
          __n = __n / uVar3;
          do {
            if ((ulong)__m >> 0x20 == 0) {
              if (__n >> 0x20 == 0) break;
            }
            else if (__n < 2) goto LAB_00452197;
            __m = (Time)((ulong)__m >> 1);
            __n = __n >> 1;
          } while( true );
        }
      }
      uVar5 = __n & 0xffffffff;
    }
  }
  goto LAB_0045219d;
LAB_00452197:
  __m.length = 0xffffffff;
  __m.clock_rate = 0;
LAB_0045219d:
  lVar6 = lVar6 + -1;
  __n = uVar5;
  if (lVar6 == 0) {
    return (Time)((ulong)__m & 0xffffffff | uVar5 << 0x20);
  }
  goto LAB_0045208a;
}

Assistant:

Storage::Time Tape::get_current_time() {
	Time time(0);
	uint64_t steps = get_offset();
	reset();
	while(steps--) {
		get_next_pulse();
		time += pulse_.length;
	}
	return time;
}